

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::shift_buckets(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                *this,size_t dist,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2)

{
  unsigned_long *puVar1;
  size_type __new_size;
  ulong uVar2;
  pointer puVar3;
  ulong uVar4;
  int iVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  size_t i;
  int iVar9;
  ulong uVar10;
  datatype mxxindex_t;
  MPI_Request recv_reqs [2];
  datatype local_60;
  undefined1 local_48 [24];
  
  __new_size = this->local_size;
  if (__new_size !=
      (long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3) {
    __assert_fail("local_size == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x264,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                 );
  }
  uVar2 = (this->part).prefix;
  puVar3 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar6 - (long)puVar3 >> 3 != __new_size) {
    if (puVar6 != puVar3) {
      (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
    local_60._vptr_datatype = (_func_int **)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (param_2,__new_size,(value_type_conflict1 *)&local_60);
  }
  local_60._vptr_datatype = (_func_int **)&PTR__datatype_001a9f70;
  local_60.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  local_60.builtin = true;
  uVar7 = uVar2 + dist;
  uVar8 = 0;
  if (uVar7 < this->n) {
    puVar1 = &(this->part).div1mod;
    if (uVar7 < *puVar1) {
      iVar9 = (int)(uVar7 / ((this->part).div + 1));
    }
    else {
      iVar9 = (int)((uVar7 - *puVar1) / (this->part).div) + (int)(this->part).mod;
    }
    uVar4 = (ulong)(iVar9 + 1);
    uVar8 = (this->part).mod;
    uVar10 = uVar4;
    if (uVar8 < uVar4) {
      uVar10 = uVar8;
    }
    uVar10 = ((this->part).div * uVar4 - uVar7) + uVar10;
    uVar8 = 0;
    if ((this->comm).m_rank != iVar9) {
      if (0x7ffffffe < uVar10) {
        __assert_fail("p1_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x27c,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start,uVar10 & 0xffffffff,&ompi_mpi_unsigned_long,iVar9,
                2,(this->comm).mpi_comm,local_48);
      uVar8 = 1;
    }
    uVar7 = this->local_size - uVar10;
    if ((uVar10 <= this->local_size && uVar7 != 0) && (this->p + -1 != iVar9)) {
      if (0x7ffffffe < uVar7) {
        __assert_fail("p2_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x28a,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start + uVar10,uVar7,&ompi_mpi_unsigned_long,iVar9 + 1,2
                ,(this->comm).mpi_comm,local_48 + uVar8 * 8);
      uVar8 = (ulong)((int)uVar8 + 1);
    }
  }
  if (dist <= (this->local_size + uVar2) - 1) {
    uVar7 = 0xffffffff;
    uVar10 = dist - uVar2;
    if (dist < uVar2 || uVar10 == 0) {
      uVar7 = uVar2 - dist;
      puVar1 = &(this->part).div1mod;
      if (uVar7 < *puVar1) {
        uVar7 = uVar7 / ((this->part).div + 1);
      }
      else {
        uVar7 = (uVar7 - *puVar1) / (this->part).div + (this->part).mod;
      }
    }
    uVar4 = this->local_size + uVar2 + ~dist;
    puVar1 = &(this->part).div1mod;
    if (uVar4 < *puVar1) {
      iVar9 = (int)(uVar4 / ((this->part).div + 1));
    }
    else {
      iVar9 = (int)((uVar4 - *puVar1) / (this->part).div) + (int)(this->part).mod;
    }
    iVar5 = (int)uVar7;
    if (iVar5 == iVar9) {
      uVar10 = 0;
    }
    else if (-1 < iVar5) {
      if (iVar5 == (this->comm).m_rank) {
        __assert_fail("p1 != comm.rank()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2a2,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      uVar10 = (this->part).mod;
      uVar4 = (ulong)(iVar5 + 1);
      if (uVar4 <= uVar10) {
        uVar10 = uVar4;
      }
      uVar10 = (dist - uVar2) + uVar10 + uVar4 * (this->part).div;
      MPI_Send((this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,uVar10 & 0xffffffff,&ompi_mpi_unsigned_long,
               uVar7,2,(this->comm).mpi_comm);
    }
    if ((this->comm).m_rank == iVar9) {
      if (uVar10 != dist) {
        __assert_fail("local_split == dist",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2b3,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      if (uVar10 < this->local_size) {
        puVar3 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar6 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          *puVar6 = puVar3[uVar10];
          uVar10 = uVar10 + 1;
          puVar6 = puVar6 + 1;
        } while (uVar10 < this->local_size);
      }
    }
    else {
      MPI_Send((this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar10,(int)this->local_size - (int)uVar10
               ,&ompi_mpi_unsigned_long,iVar9,2,(this->comm).mpi_comm);
    }
  }
  MPI_Waitall(uVar8,local_48,0);
  mxx::datatype::~datatype(&local_60);
  return;
}

Assistant:

void shift_buckets(std::size_t dist, std::vector<index_t>& local_B2) {
    // get # elements to the left
    std::size_t prev_size = part.excl_prefix_size();
    assert(local_size == local_B.size());

    // init B2
    if (local_B2.size() != local_size){
        local_B2.clear();
        local_B2.resize(local_size, 0);
    }

    mxx::datatype mxxindex_t = mxx::get_datatype<index_t>();
    MPI_Datatype mpi_index_t = mxxindex_t.type();

    MPI_Request recv_reqs[2];
    int n_irecvs = 0;
    // receive elements from the right
    if (prev_size + dist < n) {
        std::size_t right_first_gl_idx = prev_size + dist;
        int p1 = part.target_processor(right_first_gl_idx);

        std::size_t p1_gl_end = part.prefix_size(p1);
        std::size_t p1_recv_cnt = p1_gl_end - right_first_gl_idx;

        if (p1 != comm.rank()) {
            // only receive if the source is not myself (i.e., `rank`)
            // [otherwise results are directly written instead of MPI_Sended]
            assert(p1_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p1_recv_cnt;
            MPI_Irecv(&local_B2[0],recv_cnt, mpi_index_t, p1,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }

        if (p1_recv_cnt < local_size && p1 != p-1) {
            // also receive from one more processor
            int p2 = p1+1;
            // since p2 has at least local_size - 1 elements and at least
            // one element came from p1, we can assume that the receive count
            // is our local size minus the already received elements
            std::size_t p2_recv_cnt = local_size - p1_recv_cnt;

            assert(p2_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p2_recv_cnt;
            // send to `p1` (which is necessarily different from `rank`)
            MPI_Irecv(&local_B2[0] + p1_recv_cnt, recv_cnt, mpi_index_t, p2,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }
    }

    // send elements to the left (split to at most 2 target processors)
    if (prev_size + local_size - 1 >= dist) {
        int p1 = -1;
        if (prev_size >= dist) {
            std::size_t first_gl_idx = prev_size - dist;
            p1 = part.target_processor(first_gl_idx);
        }
        std::size_t last_gl_idx = prev_size + local_size - 1 - dist;
        int p2 = part.target_processor(last_gl_idx);

        std::size_t local_split;
        if (p1 != p2) {
            // local start index of area for second processor
            if (p1 >= 0) {
                local_split = part.prefix_size(p1) + dist - prev_size;
                // send to first processor
                assert(p1 != comm.rank());
                MPI_Send(&local_B[0], local_split,
                         mpi_index_t, p1, PSAC_TAG_SHIFT, comm);
            } else {
                // p1 doesn't exist, then there is no prefix to add
                local_split = dist - prev_size;
            }
        } else {
            // only one target processor
            local_split = 0;
        }

        if (p2 != comm.rank()) {
            MPI_Send(&local_B[0] + local_split, local_size - local_split,
                     mpi_index_t, p2, PSAC_TAG_SHIFT, comm);
        } else {
            // in this case the split should be exactly at `dist`
            assert(local_split == dist);
            // locally reassign
            for (std::size_t i = local_split; i < local_size; ++i) {
                local_B2[i-local_split] = local_B[i];
            }
        }
    }

    // wait for successful receive:
    MPI_Waitall(n_irecvs, recv_reqs, MPI_STATUS_IGNORE);
}